

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pac_expr.cc
# Opt level: O2

RecordField * anon_unknown.dwarf_822b7::GetRecordField(ID *id,Env *env)

{
  RecordField *pRVar1;
  Exception *this;
  allocator<char> local_39;
  string local_38;
  
  pRVar1 = (RecordField *)Env::GetField(env,id);
  if (((pRVar1->super_Field).tof_ | FLOW_FIELD) == RECORD_FIELD) {
    return pRVar1;
  }
  this = (Exception *)__cxa_allocate_exception(0x20);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_38,"not a record field",&local_39);
  Exception::Exception(this,&id->super_Object,&local_38);
  __cxa_throw(this,&Exception::typeinfo,Exception::~Exception);
}

Assistant:

RecordField* GetRecordField(const ID* id, Env* env)
	{
	Field* field = env->GetField(id);
	ASSERT(field);
	if ( field->tof() != RECORD_FIELD && field->tof() != PADDING_FIELD )
		throw Exception(id, "not a record field");
	RecordField* r = static_cast<RecordField*>(field);
	ASSERT(r);
	return r;
	}